

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ShaderMatrixCase::ShaderMatrixCase
          (ShaderMatrixCase *this,Context *context,char *name,char *desc,ShaderInput *in0,
          ShaderInput *in1,MatrixOp op,bool isVertexCase)

{
  DataType DVar1;
  TestContext *testCtx;
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  MatrixShaderEvalFunc evalFunc;
  bool isVertexCase_local;
  ShaderInput *in1_local;
  ShaderInput *in0_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  ShaderMatrixCase *this_local;
  
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderMatrixCase_0328a378;
  testCtx = gles3::Context::getTestContext(context);
  renderCtx = gles3::Context::getRenderContext(context);
  ctxInfo = gles3::Context::getContextInfo(context);
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,renderCtx,ctxInfo,name,desc,isVertexCase,
             &(this->m_matEvaluator).super_ShaderEvaluator);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderMatrixCase_0328a378;
  (this->m_in0).precision = in0->precision;
  DVar1 = in0->dataType;
  (this->m_in0).inputType = in0->inputType;
  (this->m_in0).dataType = DVar1;
  (this->m_in1).precision = in1->precision;
  DVar1 = in1->dataType;
  (this->m_in1).inputType = in1->inputType;
  (this->m_in1).dataType = DVar1;
  this->m_op = op;
  evalFunc = MatrixCaseUtils::getEvalFunc(in0,in1,op);
  MatrixShaderEvaluator::MatrixShaderEvaluator
            (&this->m_matEvaluator,evalFunc,in0->inputType,in1->inputType);
  return;
}

Assistant:

ShaderMatrixCase::ShaderMatrixCase (Context& context, const char* name, const char* desc, const ShaderInput& in0, const ShaderInput& in1, MatrixOp op, bool isVertexCase)
	: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, desc, isVertexCase, m_matEvaluator)
	, m_in0				(in0)
	, m_in1				(in1)
	, m_op				(op)
	, m_matEvaluator	(getEvalFunc(in0, in1, op), in0.inputType, in1.inputType)
{
}